

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test::TestBody
          (CoinSelection_SelectCoins_Simple_SelectCoinsBnB_empty_Test *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_type sVar4;
  uint64_t *in_R9;
  Amount AVar5;
  AssertionResult gtest_ar_;
  void *in_stack_00000138;
  AssertionResult gtest_ar_5;
  string *in_stack_00000150;
  uint32_t in_stack_0000015c;
  Txid *in_stack_00000160;
  AssertionResult gtest_ar_4;
  Script *in_stack_00000178;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Txid txid;
  TestUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *__range1;
  iterator ite;
  bool use_bnb;
  Amount tx_fee;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  Amount fee_value;
  Amount select_value;
  CoinSelectionOption option_params;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  Amount target_value;
  CoinSelection coin_select;
  reference in_stack_fffffffffffffba8;
  CoinSelectionOption *in_stack_fffffffffffffbb0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffbb8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffbd0;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  byte local_341;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  undefined8 local_320;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  undefined8 local_2f8;
  CoinSelectionOption *in_stack_fffffffffffffd10;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined8 local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined8 local_2a8;
  int64_t local_2a0;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  CoinSelectionOption *in_stack_fffffffffffffd88;
  UtxoFilter *in_stack_fffffffffffffd90;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda0;
  AssertHelper in_stack_fffffffffffffda8;
  Message local_250;
  undefined4 local_244;
  Amount *in_stack_fffffffffffffdc0;
  Amount *in_stack_fffffffffffffdc8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd0;
  AssertHelper in_stack_fffffffffffffdd8;
  Message local_220 [5];
  allocator local_1f1;
  string local_1f0 [32];
  int64_t local_1d0;
  undefined1 local_1c8;
  int64_t local_1c0;
  undefined1 local_1b8;
  Txid local_1b0;
  Txid local_190;
  reference local_170;
  TestUtxoCoinVector *local_168;
  __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
  local_160;
  vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *local_158;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_150;
  undefined1 local_141 [17];
  undefined1 local_130 [40];
  undefined1 local_108 [16];
  CoinSelectionOption local_f8;
  uint64_t local_68;
  undefined1 local_60;
  uint64_t local_48;
  undefined1 local_40;
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffffbb0,
             SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0));
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x6cc1cc0);
  local_68 = AVar5.amount_;
  local_60 = AVar5.ignore_check_;
  local_48 = local_68;
  local_40 = local_60;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x263e45);
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffffbb0);
  cfd::core::Amount::Amount((Amount *)(local_108 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_108);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x263e7f);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_141._1_8_ = AVar5.amount_;
  local_141[9] = AVar5.ignore_check_;
  local_141[0] = 0;
  local_130._0_8_ = local_141._1_8_;
  local_130[8] = local_141[9];
  std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::size
            (&kExtCoinSelectTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (in_stack_fffffffffffffbd0,CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8)
            );
  local_150._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffba8
                         );
  local_158 = &kExtCoinSelectTestVector;
  local_160._M_current =
       (TestUtxoCoinVector *)
       std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::begin
                 ((vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *)
                  in_stack_fffffffffffffba8);
  local_168 = (TestUtxoCoinVector *)
              std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::end
                        ((vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *)
                         in_stack_fffffffffffffba8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffbb0,
                            (__normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffba8), bVar1) {
    local_170 = __gnu_cxx::
                __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                ::operator*(&local_160);
    cfd::core::Txid::Txid(&local_190);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      cfd::core::Txid::Txid(&local_1b0,&local_170->txid);
      cfd::core::Txid::operator=(&local_190,&local_1b0);
      cfd::core::Txid::~Txid((Txid *)0x263fda);
    }
    AVar5 = cfd::core::Amount::CreateBySatoshiAmount(local_170->amount);
    local_1d0 = AVar5.amount_;
    local_1c8 = AVar5.ignore_check_;
    local_1c0 = local_1d0;
    local_1b8 = local_1c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"",&local_1f1);
    in_stack_fffffffffffffba8 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(&local_150);
    in_stack_fffffffffffffbb0 = (CoinSelectionOption *)0x0;
    in_R9 = (uint64_t *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_00000160,in_stack_0000015c,in_stack_00000150,
               (Amount *)gtest_ar_5.message_.ptr_,(string *)gtest_ar_5._0_8_,in_stack_00000138,
               (Utxo *)gtest_ar_4.message_.ptr_,in_stack_00000178);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(&local_150);
    cfd::core::Txid::~Txid((Txid *)0x2641b1);
    __gnu_cxx::
    __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
    ::operator++(&local_160);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo(in_stack_fffffffffffffd10);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffbb0,(double)in_stack_fffffffffffffba8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffbc0 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_141;
      in_stack_fffffffffffffbb8 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_108;
      in_stack_fffffffffffffbb0 = (CoinSelectionOption *)(local_108 + 0x10);
      in_stack_fffffffffffffba8 = (reference)local_130;
      in_R9 = &local_f8.effective_fee_baserate_;
      cfd::CoinSelection::SelectCoins
                ((CoinSelection *)in_stack_fffffffffffffda8.data_,
                 (Amount *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdc8,(Amount *)in_stack_fffffffffffffdd0.ptr_,
                 (bool *)in_stack_fffffffffffffdd8.data_);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffbc0);
    }
  }
  else {
    testing::Message::Message(local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffdd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x202,
               "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffdd8,local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdd8);
    testing::Message::~Message((Message *)0x2643ac);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10));
  local_244 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             (char *)in_stack_fffffffffffffbc0,(unsigned_long *)in_stack_fffffffffffffbb8,
             (int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdc8);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2644a1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffda8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x203,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffda8,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffda8);
    testing::Message::~Message((Message *)0x264504);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26455c);
  cfd::core::Amount::GetSatoshiValue((Amount *)(local_108 + 0x10));
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             (char *)in_stack_fffffffffffffbc0,(long *)in_stack_fffffffffffffbb8,
             (long *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd98);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x264625);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message((Message *)0x264682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2646da);
  local_2a0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_108);
  local_2a8 = 0x114;
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             (char *)in_stack_fffffffffffffbc0,(long *)in_stack_fffffffffffffbb8,
             (long *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26479d);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x205,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x2647fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x264852);
  sVar4 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10));
  if (sVar4 == 3) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10),0);
    local_2d0 = 0x3a3bd64;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              ((char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
               (char *)in_stack_fffffffffffffbc0,(unsigned_long *)in_stack_fffffffffffffbb8,
               (long *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26491b);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x207,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message((Message *)0x264978);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2649cd);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10),1);
    local_2f8 = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              ((char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
               (char *)in_stack_fffffffffffffbc0,(unsigned_long *)in_stack_fffffffffffffbb8,
               (long *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd10);
    if (!bVar1) {
      testing::Message::Message(&local_300);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x264a80);
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x208,pcVar3);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::Message::~Message((Message *)0x264add);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x264b32);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10),2);
    local_320 = 0xe3f1de;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              ((char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
               (char *)in_stack_fffffffffffffbc0,(unsigned_long *)in_stack_fffffffffffffbb8,
               (long *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar1) {
      testing::Message::Message(&local_328);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x264be5);
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x209,pcVar3);
      testing::internal::AssertHelper::operator=(&local_330,&local_328);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      testing::Message::~Message((Message *)0x264c42);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x264c97);
  }
  local_341 = ~local_141[0] & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffbb0,(bool *)in_stack_fffffffffffffba8,
             (type *)0x264cd6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)&local_340,(AssertionResult *)"use_bnb","true","false",
               (char *)in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x20b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    testing::Message::~Message((Message *)0x264dbc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x264e34);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffbc0);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x264e4e);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffbc0);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x264e68);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_SelectCoinsBnB_empty)
{
  // BnB fail. (use knapsack)
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(114040000);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);

  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)));
  EXPECT_EQ(select_utxos.size(), 3);
  EXPECT_EQ(select_value.GetSatoshiValue(), static_cast<int64_t>(115063590));
  EXPECT_EQ(fee_value.GetSatoshiValue(), static_cast<int64_t>(276));
  if (select_utxos.size() == 3) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(61062500));
    EXPECT_EQ(select_utxos[1].amount, static_cast<int64_t>(39062500));
    EXPECT_EQ(select_utxos[2].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_FALSE(use_bnb);
}